

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C_matrix.h
# Opt level: O2

C_matrix<double> * __thiscall
C_matrix<double>::operator*
          (C_matrix<double> *__return_storage_ptr__,C_matrix<double> *this,double *x)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  C_matrix(__return_storage_ptr__,this->m_L,this->m_C);
  uVar5 = 0;
  while (uVar4 = uVar5 & 0xffff, (int)uVar4 < this->m_L) {
    uVar7 = 0;
    while( true ) {
      uVar6 = uVar7 & 0xffff;
      if (this->m_C <= (int)uVar6) break;
      dVar1 = this->m_A[(int)(this->m_C * uVar4 + uVar6)];
      dVar2 = *x;
      pdVar3 = operator()(__return_storage_ptr__,(unsigned_short)uVar5,(unsigned_short)uVar7);
      *pdVar3 = dVar1 * dVar2;
      uVar7 = uVar6 + 1;
    }
    uVar5 = uVar4 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

C_matrix<dataType> C_matrix<dataType>::operator* (const dataType& x)
{
    C_matrix B(m_L,m_C);
    for(unsigned short i=0 ; i<this->m_L ; i++)
    {
        for(unsigned short j=0 ; j<this->m_C ; j++)
        {
            B(i,j) = m_A[getIndex(i,j)]*x;
        }
    }
    return B;
}